

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

void __thiscall LogToCallbackRedirector::~LogToCallbackRedirector(LogToCallbackRedirector *this)

{
  bool bVar1;
  reference ppLVar2;
  const_iterator local_40;
  _Self local_38;
  LogStream *local_30;
  _List_node_base *local_28;
  _List_iterator<Assimp::LogStream_*> local_20;
  _Self local_18;
  iterator it;
  LogToCallbackRedirector *this_local;
  
  (this->super_LogStream)._vptr_LogStream = (_func_int **)&PTR__LogToCallbackRedirector_01040388;
  it._M_node = (_List_node_base *)this;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_>::begin
                 ((list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_> *)
                  Assimp::gPredefinedStreams_abi_cxx11_);
  local_28 = (_List_node_base *)
             std::__cxx11::list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_>::end
                       ((list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_> *)
                        Assimp::gPredefinedStreams_abi_cxx11_);
  local_30 = (LogStream *)(this->stream).user;
  local_18._M_node =
       (_List_node_base *)
       std::find<std::_List_iterator<Assimp::LogStream*>,Assimp::LogStream*>
                 (local_20,(_List_iterator<Assimp::LogStream_*>)local_28,&local_30);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_>::end
                 ((list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_> *)
                  Assimp::gPredefinedStreams_abi_cxx11_);
  bVar1 = std::operator!=(&local_18,&local_38);
  if (bVar1) {
    ppLVar2 = std::_List_iterator<Assimp::LogStream_*>::operator*(&local_18);
    if (*ppLVar2 != (LogStream *)0x0) {
      (*(*ppLVar2)->_vptr_LogStream[1])();
    }
    std::_List_const_iterator<Assimp::LogStream_*>::_List_const_iterator(&local_40,&local_18);
    std::__cxx11::list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_>::erase
              ((list<Assimp::LogStream_*,_std::allocator<Assimp::LogStream_*>_> *)
               Assimp::gPredefinedStreams_abi_cxx11_,local_40);
  }
  Assimp::LogStream::~LogStream(&this->super_LogStream);
  return;
}

Assistant:

~LogToCallbackRedirector()  {
#ifndef ASSIMP_BUILD_SINGLETHREADED
        std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif
        // (HACK) Check whether the 'stream.user' pointer points to a
        // custom LogStream allocated by #aiGetPredefinedLogStream.
        // In this case, we need to delete it, too. Of course, this
        // might cause strange problems, but the chance is quite low.

        PredefLogStreamMap::iterator it = std::find(gPredefinedStreams.begin(),
            gPredefinedStreams.end(), (Assimp::LogStream*)stream.user);

        if (it != gPredefinedStreams.end()) {
            delete *it;
            gPredefinedStreams.erase(it);
        }
    }